

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackGenerator.cxx
# Opt level: O2

int __thiscall
cmCPackGenerator::RunPreinstallTarget
          (cmCPackGenerator *this,string *installProjectName,string *installDirectory,
          cmGlobalGenerator *globalGenerator,string *buildConfig)

{
  cmCPackLog *pcVar1;
  bool bVar2;
  int iVar3;
  undefined4 extraout_var;
  ostream *poVar4;
  string *psVar5;
  allocator<char> local_495;
  int retVal;
  string output;
  string local_470;
  string buildCommand;
  string tmpFile;
  ostringstream cmCPackLog_msg_2;
  ostringstream cmCPackLog_msg;
  
  iVar3 = (*globalGenerator->_vptr_cmGlobalGenerator[0x1d])(globalGenerator);
  if ((char *)CONCAT44(extraout_var,iVar3) == (char *)0x0) {
    iVar3 = 1;
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&cmCPackLog_msg,(char *)CONCAT44(extraout_var,iVar3),
               (allocator<char> *)&tmpFile);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&cmCPackLog_msg_2,"",(allocator<char> *)&local_470);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&output,"",(allocator<char> *)&retVal);
    cmGlobalGenerator::GenerateCMakeBuildCommand
              (&buildCommand,globalGenerator,(string *)&cmCPackLog_msg,buildConfig,
               (string *)&cmCPackLog_msg_2,&output,false);
    std::__cxx11::string::~string((string *)&output);
    std::__cxx11::string::~string((string *)&cmCPackLog_msg_2);
    std::__cxx11::string::~string((string *)&cmCPackLog_msg);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCPackLog_msg);
    poVar4 = std::operator<<((ostream *)&cmCPackLog_msg,"- Install command: ");
    poVar4 = std::operator<<(poVar4,(string *)&buildCommand);
    std::endl<char,std::char_traits<char>>(poVar4);
    pcVar1 = this->Logger;
    std::__cxx11::stringbuf::str();
    cmCPackLog::Log(pcVar1,4,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CPack/cmCPackGenerator.cxx"
                    ,0x2b2,_cmCPackLog_msg_2);
    std::__cxx11::string::~string((string *)&cmCPackLog_msg_2);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCPackLog_msg);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCPackLog_msg);
    poVar4 = std::operator<<((ostream *)&cmCPackLog_msg,"- Run preinstall target for: ");
    poVar4 = std::operator<<(poVar4,(string *)installProjectName);
    std::endl<char,std::char_traits<char>>(poVar4);
    pcVar1 = this->Logger;
    std::__cxx11::stringbuf::str();
    iVar3 = 1;
    cmCPackLog::Log(pcVar1,1,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CPack/cmCPackGenerator.cxx"
                    ,0x2b5,_cmCPackLog_msg_2);
    std::__cxx11::string::~string((string *)&cmCPackLog_msg_2);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCPackLog_msg);
    output._M_dataplus._M_p = (pointer)&output.field_2;
    output._M_string_length = 0;
    output.field_2._M_local_buf[0] = '\0';
    retVal = 1;
    bVar2 = cmSystemTools::RunSingleCommand
                      (&buildCommand,&output,&output,&retVal,(installDirectory->_M_dataplus)._M_p,
                       this->GeneratorVerbose,(cmDuration)0x0);
    if (bVar2 && retVal == 0) {
      std::__cxx11::string::~string((string *)&output);
      std::__cxx11::string::~string((string *)&buildCommand);
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_470,"CPACK_TOPLEVEL_DIRECTORY",&local_495);
      psVar5 = (string *)GetOption(this,&local_470);
      if (psVar5 == (string *)0x0) {
        psVar5 = &cmValue::Empty_abi_cxx11_;
      }
      _cmCPackLog_msg = (pointer)psVar5->_M_string_length;
      _cmCPackLog_msg_2 = (pointer)0x15;
      cmStrCat<>(&tmpFile,(cmAlphaNum *)&cmCPackLog_msg,(cmAlphaNum *)&cmCPackLog_msg_2);
      std::__cxx11::string::~string((string *)&local_470);
      cmGeneratedFileStream::cmGeneratedFileStream
                ((cmGeneratedFileStream *)&cmCPackLog_msg,&tmpFile,false,None);
      poVar4 = std::operator<<((ostream *)&cmCPackLog_msg,"# Run command: ");
      poVar4 = std::operator<<(poVar4,(string *)&buildCommand);
      poVar4 = std::endl<char,std::char_traits<char>>(poVar4);
      poVar4 = std::operator<<(poVar4,"# Directory: ");
      poVar4 = std::operator<<(poVar4,(string *)installDirectory);
      poVar4 = std::endl<char,std::char_traits<char>>(poVar4);
      poVar4 = std::operator<<(poVar4,"# Output:");
      poVar4 = std::endl<char,std::char_traits<char>>(poVar4);
      poVar4 = std::operator<<(poVar4,(string *)&output);
      std::endl<char,std::char_traits<char>>(poVar4);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCPackLog_msg_2);
      poVar4 = std::operator<<((ostream *)&cmCPackLog_msg_2,"Problem running install command: ");
      poVar4 = std::operator<<(poVar4,(string *)&buildCommand);
      poVar4 = std::endl<char,std::char_traits<char>>(poVar4);
      poVar4 = std::operator<<(poVar4,"Please check ");
      poVar4 = std::operator<<(poVar4,(string *)&tmpFile);
      poVar4 = std::operator<<(poVar4," for errors");
      std::endl<char,std::char_traits<char>>(poVar4);
      pcVar1 = this->Logger;
      std::__cxx11::stringbuf::str();
      cmCPackLog::Log(pcVar1,0x10,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CPack/cmCPackGenerator.cxx"
                      ,0x2c7,local_470._M_dataplus._M_p);
      std::__cxx11::string::~string((string *)&local_470);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCPackLog_msg_2);
      cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)&cmCPackLog_msg);
      std::__cxx11::string::~string((string *)&tmpFile);
      std::__cxx11::string::~string((string *)&output);
      std::__cxx11::string::~string((string *)&buildCommand);
      iVar3 = 0;
    }
  }
  return iVar3;
}

Assistant:

int cmCPackGenerator::RunPreinstallTarget(
  const std::string& installProjectName, const std::string& installDirectory,
  cmGlobalGenerator* globalGenerator, const std::string& buildConfig)
{
  // Does this generator require pre-install?
  if (const char* preinstall = globalGenerator->GetPreinstallTargetName()) {
    std::string buildCommand = globalGenerator->GenerateCMakeBuildCommand(
      preinstall, buildConfig, "", "", false);
    cmCPackLogger(cmCPackLog::LOG_DEBUG,
                  "- Install command: " << buildCommand << std::endl);
    cmCPackLogger(cmCPackLog::LOG_OUTPUT,
                  "- Run preinstall target for: " << installProjectName
                                                  << std::endl);
    std::string output;
    int retVal = 1;
    bool resB = cmSystemTools::RunSingleCommand(
      buildCommand, &output, &output, &retVal, installDirectory.c_str(),
      this->GeneratorVerbose, cmDuration::zero());
    if (!resB || retVal) {
      std::string tmpFile = cmStrCat(
        this->GetOption("CPACK_TOPLEVEL_DIRECTORY"), "/PreinstallOutput.log");
      cmGeneratedFileStream ofs(tmpFile);
      ofs << "# Run command: " << buildCommand << std::endl
          << "# Directory: " << installDirectory << std::endl
          << "# Output:" << std::endl
          << output << std::endl;
      cmCPackLogger(cmCPackLog::LOG_ERROR,
                    "Problem running install command: "
                      << buildCommand << std::endl
                      << "Please check " << tmpFile << " for errors"
                      << std::endl);
      return 0;
    }
  }

  return 1;
}